

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_predictor.h
# Opt level: O0

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForEntryId
          (MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,int entry_id)

{
  VectorD<long,_3> *in_RSI;
  GeometryAttribute *in_RDI;
  PointIndex point_id;
  VectorD<long,_3> *pos;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  GeometryAttribute *this_00;
  AttributeValueIndex att_index;
  
  this_00 = in_RDI;
  VectorD<long,_3>::VectorD(in_RSI);
  att_index.value_ = (uint)((ulong)(in_RSI->v_)._M_elems[0] >> 0x20);
  PointAttribute::mapped_index
            ((PointAttribute *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (PointIndex)(uint)in_RSI);
  VectorD<long,_3>::operator[](in_RSI,in_stack_ffffffffffffffbc);
  GeometryAttribute::ConvertValue<long>(this_00,att_index,(long *)in_RSI);
  return (VectorD<long,_3> *)in_RDI;
}

Assistant:

VectorD<int64_t, 3> GetPositionForEntryId(int entry_id) const {
    const PointIndex point_id = entry_to_point_id_map_[entry_id];
    VectorD<int64_t, 3> pos;
    pos_attribute_->ConvertValue(pos_attribute_->mapped_index(point_id),
                                 &pos[0]);
    return pos;
  }